

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

CNscPStackEntry * NscBuildUnaryOp(int nToken,CNscPStackEntry *pValue)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  CNscPStackEntry *this;
  char *pcVar4;
  NscType nType;
  NscPCode nOpCode;
  float fVar5;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript == false)) {
    if (pValue != (CNscPStackEntry *)0x0) {
      CNwnDoubleLinkList::InsertAfter(&pValue->m_link,&g_pCtx->m_listEntryFree);
    }
    CNscPStackEntry::SetType(this,NscType_Unknown);
    return this;
  }
  if (pValue == (CNscPStackEntry *)0x0) {
    __assert_fail("pValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                  ,0xa76,"CNscPStackEntry *NscBuildUnaryOp(int, CNscPStackEntry *)");
  }
  nType = pValue->m_nType;
  if (nType != NscType_Error) {
    if (nToken == 0x21) {
      if (nType == NscType_Integer) {
        if ((g_pCtx->m_fOptExpression == true) &&
           (bVar1 = CNscPStackEntry::IsSimpleConstant(pValue), bVar1)) {
          iVar2 = CNscPStackEntry::GetInteger(pValue);
          uVar3 = (uint)(iVar2 == 0);
LAB_0015aeb5:
          CNscPStackEntry::PushConstantInteger(this,uVar3);
          nType = NscType_Integer;
          goto LAB_0015af4e;
        }
        CNscPStackEntry::AppendData(this,pValue);
        nOpCode = NscPCode_LogicalNot;
LAB_0015af88:
        nType = NscType_Integer;
LAB_0015af8b:
        CNscPStackEntry::PushSimpleOp(this,nOpCode,nType);
        goto LAB_0015af4e;
      }
      pcVar4 = "!";
    }
    else if (nToken == 0x7e) {
      if (nType == NscType_Integer) {
        if ((g_pCtx->m_fOptExpression == true) &&
           (bVar1 = CNscPStackEntry::IsSimpleConstant(pValue), bVar1)) {
          uVar3 = CNscPStackEntry::GetInteger(pValue);
          uVar3 = ~uVar3;
          goto LAB_0015aeb5;
        }
        CNscPStackEntry::AppendData(this,pValue);
        nOpCode = NscPCode_BitwiseNot;
        goto LAB_0015af88;
      }
      pcVar4 = "~";
    }
    else if (nToken == 0x2d) {
      if (nType == NscType_Float) {
        if ((g_pCtx->m_fOptExpression == true) &&
           (bVar1 = CNscPStackEntry::IsSimpleConstant(pValue), bVar1)) {
          fVar5 = CNscPStackEntry::GetFloat(pValue);
          CNscPStackEntry::PushConstantFloat(this,-fVar5);
          nType = NscType_Float;
          goto LAB_0015af4e;
        }
        CNscPStackEntry::AppendData(this,pValue);
        nOpCode = NscPCode_Negate;
        nType = NscType_Float;
        goto LAB_0015af8b;
      }
      if (nType == NscType_Integer) {
        if ((g_pCtx->m_fOptExpression == true) &&
           (bVar1 = CNscPStackEntry::IsSimpleConstant(pValue), bVar1)) {
          iVar2 = CNscPStackEntry::GetInteger(pValue);
          uVar3 = -iVar2;
          goto LAB_0015aeb5;
        }
        CNscPStackEntry::AppendData(this,pValue);
        nOpCode = NscPCode_Negate;
        goto LAB_0015af88;
      }
      pcVar4 = "-";
    }
    else {
      if (nToken != 0x2b) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                      ,0xaf1,"CNscPStackEntry *NscBuildUnaryOp(int, CNscPStackEntry *)");
      }
      if ((nType & ~NscType_Void) == NscType_Integer) {
        CNscPStackEntry::AppendData(this,pValue);
        goto LAB_0015af4e;
      }
      pcVar4 = "+";
    }
    CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorOperatorTypeMismatch,pcVar4);
  }
  nType = NscType_Error;
LAB_0015af4e:
  CNscPStackEntry::SetType(this,nType);
  CNwnDoubleLinkList::InsertAfter(&pValue->m_link,&g_pCtx->m_listEntryFree);
  return this;
}

Assistant:

YYSTYPE NscBuildUnaryOp (int nToken, YYSTYPE pValue)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pValue)
			g_pCtx ->FreePStackEntry (pValue);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}
	
	//
	// Get the value
	//

	assert (pValue);

	//
	// Check for an error
	//

	NscType nType = pValue ->GetType ();
	if (nType == NscType_Error)
	{
		pOut ->SetType (NscType_Error);
	}

	//
	// Process the operator
	//

	else
	{
		switch (nToken)
		{
			case '+': //BIOWARE - Not supported by their compiler
				if (nType == NscType_Integer || 
					nType == NscType_Float)
				{
					pOut ->AppendData (pValue);
					pOut ->SetType (nType);
				}
				else
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorOperatorTypeMismatch, "+");
					pOut ->SetType (NscType_Error);
				}
				break;

			case '-':
				if (nType == NscType_Integer)
				{
					if (g_pCtx ->GetOptExpression () &&
						pValue ->IsSimpleConstant ())
					{
						pOut ->PushConstantInteger (
							- pValue ->GetInteger ());
						pOut ->SetType (nType);
					}
					else
					{
						pOut ->AppendData (pValue);
						pOut ->PushSimpleOp (NscPCode_Negate, nType);
						pOut ->SetType (nType);
					}
				}
				else if (nType == NscType_Float)
				{
					if (g_pCtx ->GetOptExpression () &&
						pValue ->IsSimpleConstant ())
					{
						pOut ->PushConstantFloat (
							- pValue ->GetFloat ());
						pOut ->SetType (nType);
				}
					else
					{
						pOut ->AppendData (pValue);
						pOut ->PushSimpleOp (NscPCode_Negate, nType);
						pOut ->SetType (nType);
					}
				}
				else
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorOperatorTypeMismatch, "-");
					pOut ->SetType (NscType_Error);
				}
				break;

			case '~':
				if (nType == NscType_Integer)
				{
					if (g_pCtx ->GetOptExpression () &&
						pValue ->IsSimpleConstant ())
					{
						pOut ->PushConstantInteger (
							~ pValue ->GetInteger ());
						pOut ->SetType (nType);
					}
					else
					{
						pOut ->AppendData (pValue);
						pOut ->PushSimpleOp (NscPCode_BitwiseNot, nType);
						pOut ->SetType (nType);
					}
				}
				else
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorOperatorTypeMismatch, "~");
					pOut ->SetType (NscType_Error);
				}
				break;

			case '!':
				if (nType == NscType_Integer)
				{
					if (g_pCtx ->GetOptExpression () &&
						pValue ->IsSimpleConstant ())
					{
						pOut ->PushConstantInteger (
							! pValue ->GetInteger ());
						pOut ->SetType (nType);
					}
					else
					{
						pOut ->AppendData (pValue);
						pOut ->PushSimpleOp (NscPCode_LogicalNot, nType);
						pOut ->SetType (nType);
					}
				}
				else
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorOperatorTypeMismatch, "!");
					pOut ->SetType (NscType_Error);
				}
				break;

			default:
				assert (false);
				g_pCtx ->GenerateMessage (NscMessage_ErrorInternalCompilerError,
					"invalid unary operator");
				pOut ->SetType (NscType_Error);
				break;
		}
	}

	//
	// Rundown
	//

    g_pCtx ->FreePStackEntry (pValue);
	return pOut;
}